

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
push_back<wchar_t_const(&)[46]>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,
          wchar_t (*val) [46])

{
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> local_31;
  string local_30;
  
  for (; ((byte)*this & 0xf) == 9;
      this = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8)) {
  }
  if (((byte)*this & 0xf) == 0xe) {
    std::
    vector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>
    ::emplace_back<wchar_t_const(&)[46]>
              ((vector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>
                *)(*(long *)(this + 8) + 8),val);
    return;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Attempting to insert into a value that is not an array",&local_31)
  ;
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_30);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

void push_back(T&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::forward<T>(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::forward<T>(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }